

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O3

_Bool Hacl_Bignum4096_32_mod_inv_prime_vartime(uint32_t *n,uint32_t *a,uint32_t *res)

{
  uint n0;
  uint32_t uVar1;
  uint uVar2;
  uint32_t *n_00;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t i_1;
  uint32_t i_2;
  uint uVar6;
  int iVar7;
  uint32_t i;
  uint uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  uint32_t n2 [128];
  uint32_t bn_zero [128];
  undefined8 local_848;
  undefined8 local_840;
  uint32_t local_838 [128];
  uint32_t local_638 [128];
  uint32_t local_438 [128];
  uint32_t local_238 [130];
  
  lVar9 = 0;
  local_848 = res;
  memset(local_238,0,0x200);
  local_238[0] = 1;
  n0 = *n;
  uVar3 = 0;
  do {
    uVar5 = local_238[lVar9];
    uVar1 = n[lVar9];
    uVar4 = FStar_UInt32_eq_mask(uVar5,uVar1);
    uVar5 = FStar_UInt32_gte_mask(uVar5,uVar1);
    uVar3 = ~(uVar5 | uVar4) | uVar3 & uVar4;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x80);
  lVar9 = 0;
  memset(local_438,0,0x200);
  uVar8 = 0xffffffff;
  do {
    uVar5 = FStar_UInt32_eq_mask(a[lVar9],local_438[lVar9]);
    uVar8 = uVar8 & uVar5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x80);
  lVar9 = 0;
  uVar10 = 0;
  local_840 = n;
  do {
    uVar5 = a[lVar9];
    uVar1 = local_840[lVar9];
    uVar4 = FStar_UInt32_eq_mask(uVar5,uVar1);
    uVar5 = FStar_UInt32_gte_mask(uVar5,uVar1);
    n_00 = local_840;
    uVar10 = ~(uVar5 | uVar4) | uVar10 & uVar4;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x80);
  lVar9 = 0;
  uVar6 = 0;
  do {
    uVar5 = FStar_UInt32_eq_mask(n_00[lVar9],0);
    uVar6 = (uVar6 ^ (uint)lVar9) & uVar5 ^ (uint)lVar9;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x80);
  uVar10 = uVar3 & ~uVar8 & -(n0 & 1) & uVar10;
  if (uVar10 == 0xffffffff) {
    memset(local_838,0,0x200);
    bVar11 = n0 < 2;
    local_838[0] = n0 - 2;
    lVar9 = 0x10;
    do {
      uVar3 = *(uint *)((long)n_00 + lVar9 + -0xc);
      *(uint *)((long)&local_848 + lVar9 + 4) = uVar3 - bVar11;
      uVar8 = *(uint *)((long)n_00 + lVar9 + -8);
      uVar2 = (uint)(uVar3 < bVar11);
      *(uint *)((long)&local_840 + lVar9) = uVar8 - uVar2;
      uVar3 = *(uint *)((long)n_00 + lVar9 + -4);
      uVar8 = (uint)(uVar8 < uVar2);
      *(uint *)((long)&local_840 + lVar9 + 4) = uVar3 - uVar8;
      uVar3 = (uint)(uVar3 < uVar8);
      bVar11 = *(uint *)((long)n_00 + lVar9) < uVar3;
      *(uint *)((long)local_838 + lVar9) = *(uint *)((long)n_00 + lVar9) - uVar3;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x200);
    local_838[0x7d] = n_00[0x7d] - (uint)bVar11;
    uVar3 = (uint)(n_00[0x7d] < (uint)bVar11);
    local_838[0x7e] = n_00[0x7e] - uVar3;
    local_838[0x7f] = n_00[0x7f] - (uint)(n_00[0x7e] < uVar3);
    memset(local_638,0,0x200);
    *(byte *)(local_438 + ((ulong)(uVar6 & 0x7ffffff) - 0x80)) =
         (byte)local_438[(ulong)(uVar6 & 0x7ffffff) - 0x80] | 1;
    iVar7 = uVar6 * 0x20 + -0x2000;
    if (iVar7 != 0) {
      iVar7 = -iVar7;
      do {
        Hacl_Bignum4096_32_add_mod(n_00,local_638,local_638,local_638);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint32(n0);
    exp_vartime_precomp(n_00,uVar5,local_638,a,0x1000,local_838,local_848);
  }
  else {
    memset(local_848,0,0x200);
  }
  return uVar10 == 0xffffffff;
}

Assistant:

bool Hacl_Bignum4096_32_mod_inv_prime_vartime(uint32_t *n, uint32_t *a, uint32_t *res)
{
  uint32_t one[128U] = { 0U };
  memset(one, 0U, 128U * sizeof (uint32_t));
  one[0U] = 1U;
  uint32_t bit0 = n[0U] & 1U;
  uint32_t m0 = 0U - bit0;
  uint32_t acc0 = 0U;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t beq = FStar_UInt32_eq_mask(one[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(one[i], n[i]);
    acc0 = (beq & acc0) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
  }
  uint32_t m1 = acc0;
  uint32_t m00 = m0 & m1;
  uint32_t bn_zero[128U] = { 0U };
  uint32_t mask = 0xFFFFFFFFU;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t uu____0 = FStar_UInt32_eq_mask(a[i], bn_zero[i]);
    mask = uu____0 & mask;
  }
  uint32_t mask1 = mask;
  uint32_t res10 = mask1;
  uint32_t m10 = res10;
  uint32_t acc = 0U;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t beq = FStar_UInt32_eq_mask(a[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(a[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
  }
  uint32_t m2 = acc;
  uint32_t is_valid_m = (m00 & ~m10) & m2;
  uint32_t nBits = 32U * Hacl_Bignum_Lib_bn_get_top_index_u32(128U, n);
  if (is_valid_m == 0xFFFFFFFFU)
  {
    uint32_t n2[128U] = { 0U };
    uint32_t c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(0U, n[0U], 2U, n2);
    uint32_t *a1 = n + 1U;
    uint32_t *res1 = n2 + 1U;
    uint32_t c = c0;
    for (uint32_t i = 0U; i < 31U; i++)
    {
      uint32_t t1 = a1[4U * i];
      uint32_t *res_i0 = res1 + 4U * i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t1, 0U, res_i0);
      uint32_t t10 = a1[4U * i + 1U];
      uint32_t *res_i1 = res1 + 4U * i + 1U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t10, 0U, res_i1);
      uint32_t t11 = a1[4U * i + 2U];
      uint32_t *res_i2 = res1 + 4U * i + 2U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t11, 0U, res_i2);
      uint32_t t12 = a1[4U * i + 3U];
      uint32_t *res_i = res1 + 4U * i + 3U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t12, 0U, res_i);
    }
    KRML_MAYBE_FOR3(i,
      124U,
      127U,
      1U,
      uint32_t t1 = a1[i];
      uint32_t *res_i = res1 + i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t1, 0U, res_i););
    uint32_t c1 = c;
    uint32_t c2 = c1;
    KRML_MAYBE_UNUSED_VAR(c2);
    exp_vartime(nBits, n, a, 4096U, n2, res);
  }
  else
  {
    memset(res, 0U, 128U * sizeof (uint32_t));
  }
  return is_valid_m == 0xFFFFFFFFU;
}